

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_enc.c
# Opt level: O1

int pgx_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  int iVar1;
  jas_image_cmpt_t *pjVar2;
  uchar *puVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  jas_matrix_t *matrix;
  char *pcVar8;
  ulong y;
  char *pcVar9;
  int iVar10;
  int iVar11;
  pgx_hdr_t hdr;
  pgx_hdr_t local_80;
  jas_matrix_t *local_58;
  ulong local_50;
  uint local_44;
  jas_image_t *local_40;
  ulong local_38;
  
  if ((image->clrspc_ & 0xffffff00U) == 0x300) {
    uVar5 = jas_image_getcmptbytype(image,0);
    if ((int)uVar5 < 0) {
      pcVar9 = "error: missing color component\n";
    }
    else {
      if (image->numcmpts_ < 2) {
        pjVar2 = image->cmpts_[uVar5];
        if (pjVar2->prec_ < 0x11) {
          local_80.sgnd = pjVar2->sgnd_ != 0;
          local_80.width = pjVar2->width_;
          local_80.height = pjVar2->height_;
          local_80.magic = 0x5047;
          local_80.bigendian = true;
          local_80.prec = (uint_fast32_t)pjVar2->prec_;
          iVar6 = jas_getdbglevel();
          if (9 < iVar6) {
            pgx_dumphdr(_stderr,&local_80);
          }
          jas_stream_printf(out,"%c%c",local_80.magic >> 8,local_80.magic & 0xff);
          pcVar9 = "PLM";
          if (local_80.bigendian != false) {
            pcVar9 = "XML";
          }
          pcVar8 = "+";
          if (local_80.sgnd != false) {
            pcVar8 = "-";
          }
          jas_stream_printf(out," %s %s %d %ld %ld\n",pcVar9 + 1,pcVar8,local_80.prec,local_80.width
                            ,local_80.height);
          if ((out->flags_ & 2) != 0) {
            return -1;
          }
          matrix = jas_matrix_create(1,local_80.width);
          if (matrix == (jas_matrix_t *)0x0) {
            return -1;
          }
          if (local_80.height != 0) {
            y = 0;
            local_58 = matrix;
            local_44 = uVar5;
            local_40 = image;
            do {
              local_38 = y;
              iVar6 = jas_image_readcmpt(local_40,local_44,0,y,local_80.width,1,local_58);
              if (iVar6 != 0) {
LAB_001341d6:
                jas_matrix_destroy(local_58);
                return -1;
              }
              if (local_80.width != 0) {
                local_50 = 0;
                do {
                  _Var4 = local_80.bigendian;
                  uVar5 = 1 << ((byte)local_80.prec & 0x1f);
                  if (local_80.sgnd == false) {
                    uVar5 = 0;
                  }
                  iVar6 = (int)local_80.prec;
                  iVar11 = iVar6 + 0xe;
                  if (-1 < iVar6 + 7) {
                    iVar11 = iVar6 + 7;
                  }
                  if (0 < iVar6) {
                    uVar5 = ~(-1 << ((byte)local_80.prec & 0x1f)) &
                            (int)(*local_58->rows_)[local_50] +
                            ((uint)((*local_58->rows_)[local_50] >> 0x3f) & uVar5);
                    iVar11 = iVar11 >> 3;
                    iVar6 = 1;
                    if (1 < iVar11) {
                      iVar6 = iVar11;
                    }
                    iVar10 = 0;
                    do {
                      iVar11 = iVar11 + -1;
                      iVar7 = iVar10;
                      if (_Var4 != false) {
                        iVar7 = iVar11;
                      }
                      if ((out->flags_ & 7U) != 0) goto LAB_001341d6;
                      if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
                        out->flags_ = out->flags_ | 4;
                        goto LAB_001341d6;
                      }
                      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
                      iVar1 = out->cnt_;
                      out->cnt_ = iVar1 + -1;
                      if (iVar1 < 1) {
                        iVar7 = jas_stream_flushbuf(out,uVar5 >> ((byte)(iVar7 << 3) & 0x3f) & 0xff)
                        ;
                        if (iVar7 == -1) goto LAB_001341d6;
                      }
                      else {
                        out->rwcnt_ = out->rwcnt_ + 1;
                        puVar3 = out->ptr_;
                        out->ptr_ = puVar3 + 1;
                        *puVar3 = (uchar)(uVar5 >> ((byte)(iVar7 << 3) & 0x3f));
                      }
                      iVar10 = iVar10 + 1;
                    } while (iVar6 != iVar10);
                  }
                  local_50 = local_50 + 1;
                } while (local_50 < local_80.width);
              }
              y = local_38 + 1;
              matrix = local_58;
            } while (y < local_80.height);
          }
          jas_matrix_destroy(matrix);
          return 0;
        }
      }
      pcVar9 = "The PGX format cannot be used to represent an image with this geometry.\n";
    }
  }
  else {
    pcVar9 = "error: PGX format does not support color space\n";
  }
  jas_eprintf(pcVar9);
  return -1;
}

Assistant:

int pgx_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	pgx_hdr_t hdr;
	uint_fast32_t width;
	uint_fast32_t height;
	bool sgnd;
	int prec;
	pgx_enc_t encbuf;
	pgx_enc_t *enc = &encbuf;

	/* Avoid compiler warnings about unused parameters. */
	(void)optstr;

	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_GRAY:
		if ((enc->cmpt = jas_image_getcmptbytype(image,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y))) < 0) {
			jas_eprintf("error: missing color component\n");
			return -1;
		}
		break;
	default:
		jas_eprintf("error: PGX format does not support color space\n");
		return -1;
		break;
	}

	width = jas_image_cmptwidth(image, enc->cmpt);
	height = jas_image_cmptheight(image, enc->cmpt);
	prec = jas_image_cmptprec(image, enc->cmpt);
	sgnd = jas_image_cmptsgnd(image, enc->cmpt);

	/* The PGX format is quite limited in the set of image geometries
	  that it can handle.  Here, we check to ensure that the image to
	  be saved can actually be represented reasonably accurately using the
	  PGX format. */
	/* There must be exactly one component. */
	if (jas_image_numcmpts(image) > 1 || prec > 16) {
		jas_eprintf("The PGX format cannot be used to represent an image with this geometry.\n");
		return -1;
	}

	hdr.magic = PGX_MAGIC;
	hdr.bigendian = true;
	hdr.sgnd = sgnd;
	hdr.prec = prec;
	hdr.width = width;
	hdr.height = height;

	if (jas_getdbglevel() >= 10) {
		pgx_dumphdr(stderr, &hdr);
	}

	if (pgx_puthdr(out, &hdr)) {
		return -1;
	}

	if (pgx_putdata(out, &hdr, image, enc->cmpt)) {
		return -1;
	}

	return 0;
}